

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unparser.cc
# Opt level: O1

Status __thiscall
google::protobuf::json_internal::anon_unknown_4::
WriteMap<google::protobuf::json_internal::UnparseProto3Type>
          (anon_unknown_4 *this,JsonWriter *writer,
          Msg<google::protobuf::json_internal::UnparseProto3Type> *msg,
          Field<google::protobuf::json_internal::UnparseProto3Type> field)

{
  int iVar1;
  ResolverPool *this_00;
  Field pFVar2;
  long lVar3;
  undefined8 uVar4;
  char *d;
  Desc *pDVar5;
  anon_union_8_1_1246618d_for_StatusOrData<bool>_1 *paVar6;
  size_t idx;
  bool bVar7;
  StatusOr<long> x;
  StatusOr<const_google::protobuf::json_internal::UntypedMessage_*> entry;
  StatusOr<bool> is_empty;
  anon_union_8_1_1246618d_for_StatusOrData<bool>_1 local_f8;
  char *local_f0;
  char *pcStack_e8;
  uint local_c4;
  anon_union_8_1_1246618d_for_StatusOrData<const_google::protobuf::json_internal::UntypedMessage_*>_1
  local_c0;
  Desc *local_b8;
  anon_union_8_1_1246618d_for_StatusOrData<bool>_1 local_b0;
  char local_a8;
  Quoted<std::basic_string_view<char,_std::char_traits<char>_>_> local_a0;
  char local_90 [32];
  undefined1 local_70 [40];
  size_t local_48;
  Msg<google::protobuf::json_internal::UnparseProto3Type> *local_40;
  Desc *local_38;
  
  io::zc_sink_internal::ZeroCopyStreamByteSink::Append(&writer->sink_,"{",1);
  writer->indent_ = writer->indent_ + 1;
  local_40 = msg;
  local_38 = (Desc *)field;
  local_48 = UntypedMessage::Count(msg,(field->raw_->field_0)._impl_.number_);
  if (local_48 == 0) {
    writer->indent_ = writer->indent_ + -1;
  }
  else {
    local_70._32_8_ = &writer->scratch_buf_;
    local_c4 = (uint)CONCAT71((int7)((ulong)local_70._32_8_ >> 8),1);
    idx = 0;
    do {
      pDVar5 = local_38;
      UnparseProto3Type::GetMessage
                ((UnparseProto3Type *)&local_c0.status_,(Field)local_38,local_40,idx);
      d = (char *)local_b8;
      *(anon_union_8_1_1246618d_for_StatusOrData<const_google::protobuf::json_internal::UntypedMessage_*>_1
        *)this = local_c0;
      if (((ulong)local_c0 & 1) == 0) {
        LOCK();
        *(int *)local_c0 = *(int *)local_c0 + 1;
        UNLOCK();
      }
      bVar7 = true;
      if (*(long *)this != 1) goto LAB_002d9113;
      if (local_c0 !=
          (anon_union_8_1_1246618d_for_StatusOrData<const_google::protobuf::json_internal::UntypedMessage_*>_1
           )0x1) {
        absl::lts_20240722::internal_statusor::Helper::Crash(&local_c0.status_);
LAB_002d925d:
        paVar6 = &local_b0;
        goto LAB_002d9269;
      }
      this_00 = local_b8->pool_;
      pFVar2 = Proto3Type::ValueField((Proto3Type *)this_00,pDVar5);
      IsEmptyValue<google::protobuf::json_internal::UnparseProto3Type>
                ((anon_unknown_4 *)&local_b0.status_,
                 (Msg<google::protobuf::json_internal::UnparseProto3Type> *)d,pFVar2);
      *(anon_union_8_1_1246618d_for_StatusOrData<bool>_1 *)this = local_b0;
      if (((ulong)local_b0 & 1) == 0) {
        LOCK();
        *(int *)local_b0 = *(int *)local_b0 + 1;
        UNLOCK();
      }
      bVar7 = true;
      if (*(long *)this != 1) goto LAB_002d9109;
      if (local_b0 != (anon_union_8_1_1246618d_for_StatusOrData<bool>_1)0x1) goto LAB_002d925d;
      if (local_a8 != '\0') {
        bVar7 = false;
        goto LAB_002d9109;
      }
      if ((local_c4 & 1) == 0) {
        d = ",";
        io::zc_sink_internal::ZeroCopyStreamByteSink::Append(&writer->sink_,",",1);
      }
      else {
        local_c4 = 0;
      }
      JsonWriter::NewLine(writer);
      pDVar5 = local_b8;
      if (local_c0 !=
          (anon_union_8_1_1246618d_for_StatusOrData<const_google::protobuf::json_internal::UntypedMessage_*>_1
           )0x1) goto LAB_002d9264;
      pFVar2 = Proto3Type::KeyField((Proto3Type *)this_00,(Desc *)d);
      iVar1 = (pFVar2->raw_->field_0)._impl_.kind_;
      switch(iVar1) {
      case 3:
      case 0x10:
      case 0x12:
        UnparseProto3Type::GetInt64((UnparseProto3Type *)&local_f8.status_,pFVar2,(Msg *)pDVar5,0);
        *(anon_union_8_1_1246618d_for_StatusOrData<bool>_1 *)this = local_f8;
        if (((ulong)local_f8 & 1) == 0) {
          LOCK();
          *(int *)local_f8 = *(int *)local_f8 + 1;
          UNLOCK();
        }
        if (local_f8 == (anon_union_8_1_1246618d_for_StatusOrData<bool>_1)0x1) {
          local_a0.value.
          super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>_>.
          super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
          _M_head_impl._M_len = (size_t)local_f0;
          JsonWriter::Write<long>(writer,(Quoted<long> *)&local_a0);
          absl::lts_20240722::internal_statusor::StatusOrData<long>::~StatusOrData
                    ((StatusOrData<long> *)&local_f8.status_);
LAB_002d908c:
          *(undefined8 *)this = 1;
        }
        else {
          absl::lts_20240722::internal_statusor::StatusOrData<long>::~StatusOrData
                    ((StatusOrData<long> *)&local_f8.status_);
        }
        break;
      case 4:
      case 6:
        UnparseProto3Type::GetUInt64((UnparseProto3Type *)&local_f8.status_,pFVar2,(Msg *)pDVar5,0);
        *(anon_union_8_1_1246618d_for_StatusOrData<bool>_1 *)this = local_f8;
        if (((ulong)local_f8 & 1) == 0) {
          LOCK();
          *(int *)local_f8 = *(int *)local_f8 + 1;
          UNLOCK();
        }
        if (local_f8 == (anon_union_8_1_1246618d_for_StatusOrData<bool>_1)0x1) {
          local_a0.value.
          super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>_>.
          super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
          _M_head_impl._M_len = (size_t)local_f0;
          JsonWriter::Write<unsigned_long>(writer,(Quoted<unsigned_long> *)&local_a0);
          absl::lts_20240722::internal_statusor::StatusOrData<unsigned_long>::~StatusOrData
                    ((StatusOrData<unsigned_long> *)&local_f8.status_);
          goto LAB_002d908c;
        }
        absl::lts_20240722::internal_statusor::StatusOrData<unsigned_long>::~StatusOrData
                  ((StatusOrData<unsigned_long> *)&local_f8.status_);
        break;
      case 5:
      case 0xf:
      case 0x11:
        UnparseProto3Type::GetInt32((UnparseProto3Type *)&local_f8.status_,pFVar2,(Msg *)pDVar5,0);
        *(anon_union_8_1_1246618d_for_StatusOrData<bool>_1 *)this = local_f8;
        if (((ulong)local_f8 & 1) == 0) {
          LOCK();
          *(int *)local_f8 = *(int *)local_f8 + 1;
          UNLOCK();
        }
        if (local_f8 == (anon_union_8_1_1246618d_for_StatusOrData<bool>_1)0x1) {
          local_a0.value.
          super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>_>.
          super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
          _M_head_impl._M_len =
               CONCAT44(local_a0.value.
                        super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>_>
                        .
                        super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                        ._M_head_impl._M_len._4_4_,(int32_t)local_f0);
          JsonWriter::Write<int>(writer,(Quoted<int> *)&local_a0);
LAB_002d9011:
          absl::lts_20240722::internal_statusor::StatusOrData<int>::~StatusOrData
                    ((StatusOrData<int> *)&local_f8.status_);
          goto LAB_002d908c;
        }
        goto LAB_002d901d;
      case 7:
      case 0xd:
        UnparseProto3Type::GetUInt32((UnparseProto3Type *)&local_f8.status_,pFVar2,(Msg *)pDVar5,0);
        *(anon_union_8_1_1246618d_for_StatusOrData<bool>_1 *)this = local_f8;
        if (((ulong)local_f8 & 1) == 0) {
          LOCK();
          *(int *)local_f8 = *(int *)local_f8 + 1;
          UNLOCK();
        }
        if (local_f8 == (anon_union_8_1_1246618d_for_StatusOrData<bool>_1)0x1) {
          local_a0.value.
          super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>_>.
          super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
          _M_head_impl._M_len =
               CONCAT44(local_a0.value.
                        super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>_>
                        .
                        super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                        ._M_head_impl._M_len._4_4_,(int32_t)local_f0);
          JsonWriter::Write<unsigned_int>(writer,(Quoted<unsigned_int> *)&local_a0);
          absl::lts_20240722::internal_statusor::StatusOrData<unsigned_int>::~StatusOrData
                    ((StatusOrData<unsigned_int> *)&local_f8.status_);
          goto LAB_002d908c;
        }
        absl::lts_20240722::internal_statusor::StatusOrData<unsigned_int>::~StatusOrData
                  ((StatusOrData<unsigned_int> *)&local_f8.status_);
        break;
      case 8:
        UnparseProto3Type::GetBool((UnparseProto3Type *)&local_f8.status_,pFVar2,(Msg *)pDVar5,0);
        *(anon_union_8_1_1246618d_for_StatusOrData<bool>_1 *)this = local_f8;
        if (((ulong)local_f8 & 1) == 0) {
          LOCK();
          *(int *)local_f8 = *(int *)local_f8 + 1;
          UNLOCK();
        }
        if (local_f8 == (anon_union_8_1_1246618d_for_StatusOrData<bool>_1)0x1) {
          local_a0.value.
          super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>_>.
          super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
          _M_head_impl._M_len = 0x34356d;
          if ((char)local_f0 != '\0') {
            local_a0.value.
            super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>_>.
            super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
            _M_head_impl._M_len = 0x352dca;
          }
          JsonWriter::Write<char_const*>(writer,(Quoted<const_char_*> *)&local_a0);
          absl::lts_20240722::internal_statusor::StatusOrData<bool>::~StatusOrData
                    ((StatusOrData<bool> *)&local_f8.status_);
          goto LAB_002d908c;
        }
        absl::lts_20240722::internal_statusor::StatusOrData<bool>::~StatusOrData
                  ((StatusOrData<bool> *)&local_f8.status_);
        break;
      case 9:
        UnparseProto3Type::GetString
                  ((StatusOr<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                   &local_f8.status_,pFVar2,(string *)local_70._32_8_,(Msg *)pDVar5,0);
        *(anon_union_8_1_1246618d_for_StatusOrData<bool>_1 *)this = local_f8;
        if (((ulong)local_f8 & 1) == 0) {
          LOCK();
          *(int *)local_f8 = *(int *)local_f8 + 1;
          UNLOCK();
        }
        if (local_f8 == (anon_union_8_1_1246618d_for_StatusOrData<bool>_1)0x1) {
          local_a0.value.
          super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>_>.
          super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
          _M_head_impl._M_len = (size_t)local_f0;
          local_a0.value.
          super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>_>.
          super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
          _M_head_impl._M_str = pcStack_e8;
          JsonWriter::Write<std::basic_string_view<char,std::char_traits<char>>>(writer,&local_a0);
          absl::lts_20240722::internal_statusor::
          StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>::~StatusOrData
                    ((StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                     &local_f8.status_);
          goto LAB_002d908c;
        }
        absl::lts_20240722::internal_statusor::
        StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>::~StatusOrData
                  ((StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                   &local_f8.status_);
        break;
      default:
        local_f8 = (anon_union_8_1_1246618d_for_StatusOrData<bool>_1)0x1a;
        local_f0 = "unsupported map key type: ";
        lVar3 = absl::lts_20240722::numbers_internal::FastIntToBuffer(iVar1,local_90);
        local_a0.value.
        super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>_>.
        super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
        _M_head_impl._M_str = local_90;
        local_a0.value.
        super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>_>.
        super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
        _M_head_impl._M_len =
             lVar3 - (long)local_a0.value.
                           super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>_>
                           .
                           super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                           ._M_head_impl._M_str;
        absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_70,(AlphaNum *)&local_f8.status_);
        absl::lts_20240722::InvalidArgumentError(this,local_70._8_8_,local_70._0_8_);
        if ((undefined1 *)local_70._0_8_ != local_70 + 0x10) {
          operator_delete((void *)local_70._0_8_,local_70._16_8_ + 1);
        }
        break;
      case 0xe:
        UnparseProto3Type::GetEnumValue
                  ((UnparseProto3Type *)&local_f8.status_,pFVar2,(Msg *)pDVar5,0);
        *(anon_union_8_1_1246618d_for_StatusOrData<bool>_1 *)this = local_f8;
        if (((ulong)local_f8 & 1) == 0) {
          LOCK();
          *(int *)local_f8 = *(int *)local_f8 + 1;
          UNLOCK();
        }
        if (local_f8 == (anon_union_8_1_1246618d_for_StatusOrData<bool>_1)0x1) {
          WriteEnum<google::protobuf::json_internal::UnparseProto3Type>
                    (writer,pFVar2,(int32_t)local_f0,kQuoted);
          goto LAB_002d9011;
        }
LAB_002d901d:
        absl::lts_20240722::internal_statusor::StatusOrData<int>::~StatusOrData
                  ((StatusOrData<int> *)&local_f8.status_);
      }
      if (*(long *)this == 1) {
        pDVar5 = (Desc *)0x3ec940;
        io::zc_sink_internal::ZeroCopyStreamByteSink::Append(&writer->sink_,":",1);
        if ((writer->options_).add_whitespace == true) {
          pDVar5 = (Desc *)0x36de10;
          io::zc_sink_internal::ZeroCopyStreamByteSink::Append(&writer->sink_," ",1);
        }
        pFVar2 = Proto3Type::ValueField((Proto3Type *)this_00,pDVar5);
        if (local_c0 !=
            (anon_union_8_1_1246618d_for_StatusOrData<const_google::protobuf::json_internal::UntypedMessage_*>_1
             )0x1) {
LAB_002d9264:
          paVar6 = (anon_union_8_1_1246618d_for_StatusOrData<bool>_1 *)&local_c0;
LAB_002d9269:
          absl::lts_20240722::internal_statusor::Helper::Crash(&paVar6->status_);
          absl::lts_20240722::internal_statusor::Helper::Crash(&local_f8.status_);
          absl::lts_20240722::internal_statusor::Helper::Crash(&local_f8.status_);
          absl::lts_20240722::internal_statusor::Helper::Crash(&local_f8.status_);
          absl::lts_20240722::internal_statusor::Helper::Crash(&local_f8.status_);
          absl::lts_20240722::internal_statusor::Helper::Crash(&local_f8.status_);
          absl::lts_20240722::internal_statusor::Helper::Crash(&local_f8.status_);
          uVar4 = absl::lts_20240722::internal_statusor::Helper::Crash(&local_f8.status_);
          absl::lts_20240722::internal_statusor::StatusOrData<bool>::~StatusOrData
                    ((StatusOrData<bool> *)&local_f8.status_);
          absl::lts_20240722::internal_statusor::StatusOrData<bool>::~StatusOrData
                    ((StatusOrData<bool> *)&local_b0.status_);
          absl::lts_20240722::internal_statusor::
          StatusOrData<const_google::protobuf::json_internal::UntypedMessage_*>::~StatusOrData
                    ((StatusOrData<const_google::protobuf::json_internal::UntypedMessage_*> *)
                     &local_c0.status_);
          _Unwind_Resume(uVar4);
        }
        (anonymous_namespace)::
        WriteSingular<google::protobuf::json_internal::UnparseProto3Type,google::protobuf::json_internal::UntypedMessage_const&>
                  ((_anonymous_namespace_ *)this,writer,pFVar2,(UntypedMessage *)local_b8);
        bVar7 = *(long *)this != 1;
      }
LAB_002d9109:
      absl::lts_20240722::internal_statusor::StatusOrData<bool>::~StatusOrData
                ((StatusOrData<bool> *)&local_b0.status_);
LAB_002d9113:
      absl::lts_20240722::internal_statusor::
      StatusOrData<const_google::protobuf::json_internal::UntypedMessage_*>::~StatusOrData
                ((StatusOrData<const_google::protobuf::json_internal::UntypedMessage_*> *)
                 &local_c0.status_);
      if (bVar7) {
        return (Status)(uintptr_t)this;
      }
      idx = idx + 1;
    } while (local_48 != idx);
    writer->indent_ = writer->indent_ + -1;
    if ((local_c4 & 1) == 0) {
      JsonWriter::NewLine(writer);
    }
  }
  io::zc_sink_internal::ZeroCopyStreamByteSink::Append(&writer->sink_,"}",1);
  *(undefined8 *)this = 1;
  return (Status)(uintptr_t)this;
}

Assistant:

absl::Status WriteMap(JsonWriter& writer, const Msg<Traits>& msg,
                      Field<Traits> field) {
  writer.Write("{");
  writer.Push();

  size_t count = Traits::GetSize(field, msg);
  bool first = true;
  for (size_t i = 0; i < count; ++i) {
    absl::StatusOr<const Msg<Traits>*> entry =
        Traits::GetMessage(field, msg, i);
    RETURN_IF_ERROR(entry.status());
    const Desc<Traits>& type = Traits::GetDesc(**entry);

    auto is_empty = IsEmptyValue<Traits>(**entry, Traits::ValueField(type));
    RETURN_IF_ERROR(is_empty.status());
    if (*is_empty) {
      // Empty google.protobuf.Values are silently discarded.
      continue;
    }

    writer.WriteComma(first);
    writer.NewLine();
    RETURN_IF_ERROR(
        WriteMapKey<Traits>(writer, **entry, Traits::KeyField(type)));
    writer.Write(":");
    writer.Whitespace(" ");
    RETURN_IF_ERROR(
        WriteSingular<Traits>(writer, Traits::ValueField(type), **entry));
  }

  writer.Pop();
  if (!first) {
    writer.NewLine();
  }
  writer.Write("}");
  return absl::OkStatus();
}